

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O1

void __thiscall agge::tests::ArcCurveTests::FirstElementIsALineToTheEndPoint(ArcCurveTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  int iVar3;
  FailedAssertion *pFVar4;
  real_t y;
  real_t x;
  arc a2;
  arc a1;
  float local_e8;
  float local_e4;
  string local_e0;
  LocationInfo local_c0;
  string local_98;
  real_t local_74;
  arc local_70;
  arc local_50;
  
  local_e4 = 0.0;
  local_74 = 1.5707964;
  arc::arc(&local_50,13.1,-17.2,10.1,0.0,1.5707964,0.05);
  arc::arc(&local_70,-122.3,19.4,17.3,local_74,3.1415927,0.05);
  iVar3 = arc::vertex(&local_50,(real_t *)&local_c0,(real_t *)&local_e0);
  local_e8 = 0.0;
  if (iVar3 != 0) {
    do {
      local_e4 = local_c0.filename._M_dataplus._M_p._0_4_;
      local_e8 = local_e0._M_dataplus._M_p._0_4_;
      iVar3 = arc::vertex(&local_50,(real_t *)&local_c0,(real_t *)&local_e0);
    } while (iVar3 != 0);
  }
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_c0,&local_98,0x13a);
  if (ABS(((13.1 - local_e4) + (13.1 - local_e4)) / (local_e4 + 13.1)) <= 1e-05) {
    pvVar2 = (void *)((long)&local_c0 + 0x10);
    if ((void *)CONCAT44(local_c0.filename._M_dataplus._M_p._4_4_,
                         local_c0.filename._M_dataplus._M_p._0_4_) != pvVar2) {
      operator_delete((void *)CONCAT44(local_c0.filename._M_dataplus._M_p._4_4_,
                                       local_c0.filename._M_dataplus._M_p._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
               ,"");
    ut::LocationInfo::LocationInfo(&local_c0,&local_98,0x13b);
    if (ABS(((-7.1 - local_e8) + (-7.1 - local_e8)) / (local_e8 + -7.1)) <= 1e-05) {
      if ((void *)CONCAT44(local_c0.filename._M_dataplus._M_p._4_4_,
                           local_c0.filename._M_dataplus._M_p._0_4_) != pvVar2) {
        operator_delete((void *)CONCAT44(local_c0.filename._M_dataplus._M_p._4_4_,
                                         local_c0.filename._M_dataplus._M_p._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      iVar3 = arc::vertex(&local_70,(real_t *)&local_c0,(real_t *)&local_e0);
      if (iVar3 != 0) {
        do {
          local_e4 = local_c0.filename._M_dataplus._M_p._0_4_;
          local_e8 = local_e0._M_dataplus._M_p._0_4_;
          iVar3 = arc::vertex(&local_70,(real_t *)&local_c0,(real_t *)&local_e0);
        } while (iVar3 != 0);
      }
      local_98._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_c0,&local_98,0x142);
      if (ABS(((-139.6 - local_e4) + (-139.6 - local_e4)) / (local_e4 + -139.6)) <= 1e-05) {
        if ((void *)CONCAT44(local_c0.filename._M_dataplus._M_p._4_4_,
                             local_c0.filename._M_dataplus._M_p._0_4_) != pvVar2) {
          operator_delete((void *)CONCAT44(local_c0.filename._M_dataplus._M_p._4_4_,
                                           local_c0.filename._M_dataplus._M_p._0_4_));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar1) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        local_98._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,
                   "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
                   ,"");
        ut::LocationInfo::LocationInfo(&local_c0,&local_98,0x143);
        if (ABS(((19.4 - local_e8) + (19.4 - local_e8)) / (local_e8 + 19.4)) <= 1e-05) {
          if ((void *)CONCAT44(local_c0.filename._M_dataplus._M_p._4_4_,
                               local_c0.filename._M_dataplus._M_p._0_4_) != pvVar2) {
            operator_delete((void *)CONCAT44(local_c0.filename._M_dataplus._M_p._4_4_,
                                             local_c0.filename._M_dataplus._M_p._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          return;
        }
        pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"Values are not approximately equal!","");
        ut::FailedAssertion::FailedAssertion(pFVar4,&local_e0,&local_c0);
        __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
      }
      pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"Values are not approximately equal!","");
      ut::FailedAssertion::FailedAssertion(pFVar4,&local_e0,&local_c0);
      __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Values are not approximately equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_e0,&local_c0);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e0,"Values are not approximately equal!","");
  ut::FailedAssertion::FailedAssertion(pFVar4,&local_e0,&local_c0);
  __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( FirstElementIsALineToTheEndPoint )
			{
				// INIT
				arc a1(13.1f, -17.2f, 10.1f, 0.0f * pi, 0.5f * pi);
				arc a2(-122.3f, 19.4f, 17.3f, 0.5f * pi, 1.0f * pi);
				real_t prev_x = 0.0f, prev_y = 0.0f;

				// ACT
				for (real_t x, y; path_command_stop != a1.vertex(&x, &y); )
					prev_x = x, prev_y = y;

				// ASSERT
				assert_approx_equal(13.1f, prev_x, 0.00001);
				assert_approx_equal(-7.1f, prev_y, 0.00001);

				// ACT
				for (real_t x, y; path_command_stop != a2.vertex(&x, &y); )
					prev_x = x, prev_y = y;

				// ASSERT
				assert_approx_equal(-139.6f, prev_x, 0.00001);
				assert_approx_equal(19.4f, prev_y, 0.00001);
			}